

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O3

void fe::operations::
     applyOperationT<fe::operations::op_blend_one_invSrcAlpha,fe::PixelA8,fe::PixelA8>
               (op_blend_one_invSrcAlpha *op,PixelA8 *srcPixelFormat,PixelA8 *destPixelFormat,
               ImageData *src,ImageData *dest)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  byte *pbVar5;
  byte *pbVar6;
  int iVar7;
  byte *pbVar8;
  byte *pbVar9;
  uint uVar10;
  
  bVar4 = check(src,dest);
  if ((bVar4) && (iVar1 = (dest->super_fe_image).h, iVar1 != 0)) {
    iVar2 = (dest->super_fe_image).w;
    pbVar8 = (dest->super_fe_image).data;
    pbVar9 = (src->super_fe_image).data;
    iVar7 = 0;
    iVar3 = iVar2;
    pbVar6 = pbVar9;
    pbVar5 = pbVar8;
    do {
      for (; iVar3 != 0; iVar3 = iVar3 + -1) {
        uVar10 = ((uint)(byte)~*pbVar9 * (uint)*pbVar8) / 0xff + (uint)*pbVar9;
        if (0xfe < uVar10) {
          uVar10 = 0xff;
        }
        *pbVar8 = (byte)uVar10;
        pbVar8 = pbVar8 + (dest->super_fe_image).bytespp;
        pbVar9 = pbVar9 + (src->super_fe_image).bytespp;
      }
      pbVar9 = pbVar6 + (src->super_fe_image).pitch;
      pbVar8 = pbVar5 + (dest->super_fe_image).pitch;
      iVar7 = iVar7 + 1;
      iVar3 = iVar2;
      pbVar6 = pbVar9;
      pbVar5 = pbVar8;
    } while (iVar7 != iVar1);
  }
  return;
}

Assistant:

void applyOperationT(const Op& op, const Src& srcPixelFormat, Dest& destPixelFormat, const ImageData& src, const ImageData& dest)
        {
            if (!check(src, dest))
                return;

            const unsigned char* srcBuffer = (unsigned char*)src.data;
            unsigned char* destBuffer = (unsigned char*)dest.data;

            int w = dest.w;
            int h = dest.h;

            for (int y = 0; y != h; ++y)
            {
                const unsigned char* srcLine = srcBuffer;
                unsigned char* destLine = destBuffer;

                for (int x = 0; x != w; ++x)
                {
                    op(srcPixelFormat, destPixelFormat, srcLine, destLine, x, y);

                    destLine += dest.bytespp;
                    srcLine += src.bytespp;
                }

                srcBuffer += src.pitch;
                destBuffer += dest.pitch;
            }
        }